

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deformableconv2d_x86_avx.cpp
# Opt level: O2

int __thiscall
ncnn::DeformableConv2D_x86_avx::forward
          (DeformableConv2D_x86_avx *this,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  int iVar1;
  int iVar2;
  Mat *pMVar3;
  size_t _elemsize;
  Mat *this_00;
  bool bVar4;
  bool bVar5;
  ulong uVar6;
  float fVar7;
  float fVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  uint _w;
  int iVar11;
  int iVar12;
  uint uVar13;
  _func_int *p_Var14;
  long lVar15;
  int *piVar16;
  uint uVar17;
  long lVar18;
  int _h;
  int _h_00;
  int iVar19;
  int iVar20;
  long lVar21;
  bool bVar22;
  int iVar23;
  float *pfVar24;
  int iVar25;
  int iVar26;
  void *pvVar27;
  bool bVar28;
  int iVar29;
  long lVar30;
  long lVar31;
  long lVar32;
  bool bVar33;
  bool bVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  Mat local_248;
  ulong local_200;
  _func_int **local_1f8;
  int local_1ec;
  int local_1e8;
  int local_1e4;
  int local_1e0;
  int local_1dc;
  _func_int **local_1d8;
  pointer local_1d0;
  Mat local_1c8;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_180;
  Mat *local_178;
  ulong local_170;
  long local_168;
  void *local_160;
  long local_158;
  long local_150;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_148;
  pointer local_140;
  void *local_138;
  void *local_130;
  DeformableConv2D_x86_avx *local_128;
  long local_120;
  long local_118;
  _func_int **local_110;
  Mat local_108;
  Mat local_c0;
  Mat local_78;
  
  pMVar3 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
           super__Vector_impl_data._M_start;
  local_1d0 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
              super__Vector_impl_data._M_finish;
  local_200 = (ulong)(uint)pMVar3->w;
  iVar1 = pMVar3->h;
  p_Var14 = this->_vptr_DeformableConv2D_x86_avx[-3];
  iVar2 = pMVar3->c;
  _elemsize = pMVar3->elemsize;
  iVar25 = (~((*(int *)(&this->field_0xd4 + (long)p_Var14) + -1) *
             *(int *)(&this->field_0xdc + (long)p_Var14)) + pMVar3->w +
            *(int *)(&this->field_0xec + (long)p_Var14) +
           *(int *)(&this->field_0xf0 + (long)p_Var14)) /
           *(int *)(&this->field_0xe4 + (long)p_Var14);
  uVar6 = (long)(~((*(int *)(&this->field_0xd8 + (long)p_Var14) + -1) *
                  *(int *)(&this->field_0xe0 + (long)p_Var14)) + iVar1 +
                 *(int *)(&this->field_0xf4 + (long)p_Var14) +
                *(int *)(&this->field_0xf8 + (long)p_Var14)) /
          (long)*(int *)(&this->field_0xe8 + (long)p_Var14);
  local_1c8.cstep = 0;
  _w = iVar25 + 1;
  _h = (int)uVar6 + 1;
  _h_00 = _h * _w;
  local_1c8.data = (void *)0x0;
  local_1c8.refcount._0_4_ = 0;
  local_1c8.refcount._4_4_ = 0;
  local_1c8.elemsize._0_4_ = 0;
  local_1c8.elemsize._4_4_ = 0;
  local_1c8.elempack = 0;
  local_1c8.allocator = (Allocator *)0x0;
  local_1c8.dims = 0;
  local_1c8.w = 0;
  local_1c8.h = 0;
  local_1c8.d = 0;
  local_1c8.c = 0;
  local_148 = bottom_blobs;
  Mat::create(&local_1c8,
              *(int *)(&this->field_0xd8 + (long)p_Var14) * iVar2 *
              *(int *)(&this->field_0xd4 + (long)p_Var14) * _h_00,_elemsize,opt->blob_allocator);
  iVar11 = -100;
  if ((local_1c8.data != (void *)0x0) && ((long)local_1c8.c * local_1c8.cstep != 0)) {
    this_00 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
              super__Vector_impl_data._M_start;
    local_1f8 = (_func_int **)(uVar6 & 0xffffffff);
    Mat::create(this_00,*(int *)(&this->field_0xd0 + (long)this->_vptr_DeformableConv2D_x86_avx[-3])
                ,_h_00,_elemsize,opt->blob_allocator);
    if ((this_00->data != (void *)0x0) && ((long)this_00->c * this_00->cstep != 0)) {
      iVar19 = iVar1 * (int)local_200;
      local_180 = top_blobs;
      local_178 = this_00;
      Mat::reshape(&local_78,pMVar3,iVar19 * iVar2,(Allocator *)0x0);
      Mat::reshape(&local_c0,pMVar3 + 1,pMVar3[1].h * pMVar3[1].w * pMVar3[1].c,(Allocator *)0x0);
      local_1d0 = (pointer)((long)local_1d0 - (long)pMVar3);
      local_130 = local_78.data;
      iVar11 = (int)local_200;
      local_138 = local_c0.data;
      local_160 = local_1c8.data;
      local_1ec = iVar11 + -1;
      local_1e8 = 0;
      if (0 < iVar2) {
        local_1e8 = iVar2;
      }
      local_150 = (long)iVar25;
      local_170 = (ulong)_w;
      local_168 = (long)(int)local_1f8;
      lVar15 = 0;
      while (lVar30 = lVar15, lVar30 <= local_168) {
        local_1d8 = this->_vptr_DeformableConv2D_x86_avx;
        local_158 = lVar30 * local_170;
        lVar15 = 0;
        while (lVar21 = lVar15, lVar21 <= local_150) {
          p_Var14 = local_1d8[-3];
          iVar29 = (int)lVar30;
          local_1e0 = *(int *)(&this->field_0xe8 + (long)p_Var14) * iVar29 -
                      *(int *)(&this->field_0xf4 + (long)p_Var14);
          iVar20 = (int)lVar21;
          local_1e4 = *(int *)(&this->field_0xe4 + (long)p_Var14) * iVar20 -
                      *(int *)(&this->field_0xec + (long)p_Var14);
          pfVar24 = (float *)((long)local_1c8.data +
                             (long)(((int)local_158 + iVar20) * iVar2 *
                                    *(int *)(&this->field_0xd8 + (long)p_Var14) *
                                   *(int *)(&this->field_0xd4 + (long)p_Var14)) * 4);
          local_1f8 = this->_vptr_DeformableConv2D_x86_avx;
          iVar25 = 0;
          while (iVar23 = iVar25, iVar23 < *(int *)(&this->field_0xd8 + (long)p_Var14)) {
            local_140 = (local_148->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                        _M_impl.super__Vector_impl_data._M_start;
            local_110 = this->_vptr_DeformableConv2D_x86_avx;
            for (iVar25 = 0; iVar25 < *(int *)(&this->field_0xd4 + (long)local_1f8[-3]);
                iVar25 = iVar25 + 1) {
              iVar12 = *(int *)(&this->field_0xd4 + (long)local_1f8[-3]) * iVar23 + iVar25;
              fVar35 = 1.0;
              if (local_1d0 == (pointer)0xd8) {
                fVar35 = *(float *)((long)local_140[2].data +
                                   lVar21 * 4 +
                                   local_140[2].w * lVar30 * local_140[2].elemsize +
                                   (long)iVar12 * local_140[2].cstep * local_140[2].elemsize);
              }
              fVar7 = (float)(*(int *)(&this->field_0xe0 + (long)local_110[-3]) * iVar23 + local_1e0
                             ) +
                      *(float *)((long)local_c0.data +
                                (long)(int)((iVar12 * 2 * _h + iVar29) * _w + iVar20) * 4);
              fVar8 = (float)(*(int *)(&this->field_0xdc + (long)local_110[-3]) * iVar25 + local_1e4
                             ) +
                      *(float *)((long)local_c0.data +
                                (long)(int)(((iVar12 * 2 + 1) * _h + iVar29) * _w + iVar20) * 4);
              pvVar27 = local_78.data;
              iVar12 = local_1e8;
              if (((float)iVar11 <= fVar8 || (float)iVar1 <= fVar7) ||
                  (fVar8 <= -1.0 || fVar7 <= -1.0)) {
                fVar36 = 0.0;
                bVar34 = false;
                fVar37 = 0.0;
                fVar38 = 0.0;
                bVar28 = false;
                bVar22 = false;
                bVar33 = false;
                lVar15 = 0;
                lVar32 = 0;
                lVar18 = 0;
                lVar31 = 0;
                fVar39 = 0.0;
              }
              else {
                auVar9 = vroundss_avx(ZEXT416((uint)fVar7),ZEXT416((uint)fVar7),9);
                uVar13 = (uint)auVar9._0_4_;
                auVar10 = vroundss_avx(ZEXT416((uint)fVar8),ZEXT416((uint)fVar8),9);
                uVar17 = (uint)auVar10._0_4_;
                fVar40 = fVar7 - auVar9._0_4_;
                fVar38 = fVar8 - auVar10._0_4_;
                bVar4 = (int)uVar17 < local_1ec;
                bVar28 = -1 < (int)uVar13 && bVar4;
                bVar5 = (int)uVar13 < iVar1 + -1;
                bVar22 = -1 < (int)uVar17 && bVar5;
                bVar33 = bVar5 && bVar4;
                bVar34 = -1 < (int)(uVar13 | uVar17);
                lVar15 = (long)(int)(iVar11 * uVar13 + uVar17);
                if (!bVar34) {
                  lVar15 = 0;
                }
                lVar32 = (long)(int)(iVar11 * uVar13 + uVar17 + 1);
                if (-1 >= (int)uVar13 || !bVar4) {
                  lVar32 = 0;
                }
                iVar26 = (uVar13 + 1) * iVar11;
                lVar18 = (long)(int)(uVar17 + iVar26);
                if (-1 >= (int)uVar17 || !bVar5) {
                  lVar18 = 0;
                }
                lVar31 = (long)(int)(iVar26 + uVar17 + 1);
                if (!bVar5 || !bVar4) {
                  lVar31 = 0;
                }
                fVar39 = (1.0 - fVar38) * (1.0 - fVar40);
                fVar36 = fVar38 * (1.0 - fVar40);
                fVar37 = (1.0 - fVar38) * fVar40;
                fVar38 = fVar38 * fVar40;
              }
              while (iVar12 != 0) {
                fVar40 = 0.0;
                if (((float)iVar11 > fVar8 && (float)iVar1 > fVar7) &&
                    (fVar8 > -1.0 && fVar7 > -1.0)) {
                  fVar41 = 0.0;
                  if (bVar34) {
                    fVar41 = *(float *)((long)pvVar27 + lVar15 * 4);
                  }
                  if (bVar28) {
                    fVar40 = *(float *)((long)pvVar27 + lVar32 * 4);
                  }
                  fVar43 = 0.0;
                  fVar42 = 0.0;
                  if (bVar22) {
                    fVar42 = *(float *)((long)pvVar27 + lVar18 * 4);
                  }
                  if (bVar33) {
                    fVar43 = *(float *)((long)pvVar27 + lVar31 * 4);
                  }
                  fVar40 = fVar40 * fVar36 + fVar41 * fVar39 + fVar42 * fVar37 + fVar43 * fVar38;
                }
                *pfVar24 = fVar40 * fVar35;
                pfVar24 = pfVar24 + 1;
                pvVar27 = (void *)((long)pvVar27 + (long)iVar19 * 4);
                iVar12 = iVar12 + -1;
              }
            }
            p_Var14 = local_1d8[-3];
            local_1dc = iVar23;
            iVar25 = iVar23 + 1;
          }
          local_118 = lVar21;
          lVar15 = lVar21 + 1;
        }
        local_120 = lVar30;
        lVar15 = lVar30 + 1;
      }
      local_128 = this;
      Mat::reshape(&local_248,&local_1c8,
                   iVar2 * *(int *)(&this->field_0xd8 +
                                   (long)this->_vptr_DeformableConv2D_x86_avx[-3]) *
                   *(int *)(&this->field_0xd4 + (long)this->_vptr_DeformableConv2D_x86_avx[-3]),
                   _h_00,(Allocator *)0x0);
      piVar16 = (int *)CONCAT44(local_248.refcount._4_4_,local_248.refcount._0_4_);
      if (piVar16 != (int *)0x0) {
        LOCK();
        *piVar16 = *piVar16 + 1;
        UNLOCK();
      }
      piVar16 = (int *)CONCAT44(local_1c8.refcount._4_4_,local_1c8.refcount._0_4_);
      if (piVar16 != (int *)0x0) {
        LOCK();
        *piVar16 = *piVar16 + -1;
        UNLOCK();
        if (*piVar16 == 0) {
          if (local_1c8.allocator == (Allocator *)0x0) {
            free(local_1c8.data);
          }
          else {
            (*(local_1c8.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      piVar16 = (int *)CONCAT44(local_248.refcount._4_4_,local_248.refcount._0_4_);
      local_1c8.data = local_248.data;
      local_1c8.refcount._0_4_ = local_248.refcount._0_4_;
      local_1c8.refcount._4_4_ = local_248.refcount._4_4_;
      local_1c8.elemsize._0_4_ = (undefined4)local_248.elemsize;
      local_1c8.elemsize._4_4_ = local_248.elemsize._4_4_;
      local_1c8.elempack = local_248.elempack;
      local_1c8.allocator = local_248.allocator;
      local_1c8.dims = local_248.dims;
      local_1c8.w = local_248.w;
      local_1c8.h = local_248.h;
      local_1c8.d = local_248.d;
      local_1c8.c = local_248.c;
      local_1c8.cstep = local_248.cstep;
      if (piVar16 != (int *)0x0) {
        LOCK();
        *piVar16 = *piVar16 + -1;
        UNLOCK();
        if (*piVar16 == 0) {
          if (local_248.allocator == (Allocator *)0x0) {
            free(local_248.data);
          }
          else {
            (*(local_248.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      pMVar3 = local_178;
      (*this->inner_product->_vptr_Layer[7])(this->inner_product,&local_1c8,local_178,opt);
      local_248.cstep = 0;
      local_248.data = (void *)0x0;
      local_248.refcount._0_4_ = 0;
      local_248.refcount._4_4_ = 0;
      local_248.elemsize._0_4_ = 0;
      local_248.elemsize._4_4_ = 0;
      local_248.elempack = 0;
      local_248.allocator = (Allocator *)0x0;
      local_248.dims = 0;
      local_248.w = 0;
      local_248.h = 0;
      local_248.d = 0;
      local_248.c = 0;
      (*this->permute->_vptr_Layer[7])(this->permute,pMVar3,&local_248,opt);
      Mat::reshape(&local_108,&local_248,_w,_h,
                   *(int *)(&this->field_0xd0 + (long)this->_vptr_DeformableConv2D_x86_avx[-3]),
                   (Allocator *)0x0);
      if (local_108.refcount != (int *)0x0) {
        LOCK();
        *local_108.refcount = *local_108.refcount + 1;
        UNLOCK();
      }
      piVar16 = (int *)CONCAT44(local_248.refcount._4_4_,local_248.refcount._0_4_);
      if (piVar16 != (int *)0x0) {
        LOCK();
        *piVar16 = *piVar16 + -1;
        UNLOCK();
        if (*piVar16 == 0) {
          if (local_248.allocator == (Allocator *)0x0) {
            free(local_248.data);
          }
          else {
            (*(local_248.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      local_248.data = local_108.data;
      local_248.refcount._0_4_ = SUB84(local_108.refcount,0);
      local_248.refcount._4_4_ = (undefined4)((ulong)local_108.refcount >> 0x20);
      local_248.elemsize._0_4_ = (undefined4)local_108.elemsize;
      local_248.elemsize._4_4_ = (undefined4)(local_108.elemsize >> 0x20);
      local_248.elempack = local_108.elempack;
      local_248.allocator = local_108.allocator;
      local_248.dims = local_108.dims;
      local_248.w = local_108.w;
      local_248.h = local_108.h;
      local_248.d = local_108.d;
      local_248.c = local_108.c;
      local_248.cstep = local_108.cstep;
      if (local_108.refcount != (int *)0x0) {
        LOCK();
        *local_108.refcount = *local_108.refcount + -1;
        UNLOCK();
        if (*local_108.refcount == 0) {
          if (local_108.allocator == (Allocator *)0x0) {
            free(local_108.data);
          }
          else {
            (*(local_108.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      pMVar3 = (local_180->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
               super__Vector_impl_data._M_start;
      piVar16 = (int *)CONCAT44(local_248.refcount._4_4_,local_248.refcount._0_4_);
      if (pMVar3 != &local_248) {
        if (piVar16 != (int *)0x0) {
          LOCK();
          *piVar16 = *piVar16 + 1;
          UNLOCK();
        }
        piVar16 = pMVar3->refcount;
        if (piVar16 != (int *)0x0) {
          LOCK();
          *piVar16 = *piVar16 + -1;
          UNLOCK();
          if (*piVar16 == 0) {
            if (pMVar3->allocator == (Allocator *)0x0) {
              free(pMVar3->data);
            }
            else {
              (*pMVar3->allocator->_vptr_Allocator[3])();
            }
          }
        }
        pMVar3->cstep = 0;
        pMVar3->data = (void *)0x0;
        pMVar3->refcount = (int *)0x0;
        *(undefined8 *)((long)&pMVar3->refcount + 4) = 0;
        *(undefined8 *)((long)&pMVar3->elemsize + 4) = 0;
        pMVar3->c = 0;
        pMVar3->dims = 0;
        pMVar3->w = 0;
        pMVar3->h = 0;
        pMVar3->d = 0;
        piVar16 = (int *)CONCAT44(local_248.refcount._4_4_,local_248.refcount._0_4_);
        pMVar3->data = local_248.data;
        pMVar3->refcount = (int *)CONCAT44(local_248.refcount._4_4_,local_248.refcount._0_4_);
        pMVar3->elemsize = CONCAT44(local_248.elemsize._4_4_,(undefined4)local_248.elemsize);
        pMVar3->elempack = local_248.elempack;
        pMVar3->allocator = local_248.allocator;
        pMVar3->dims = local_248.dims;
        pMVar3->w = local_248.w;
        pMVar3->h = local_248.h;
        pMVar3->d = local_248.d;
        pMVar3->c = local_248.c;
        pMVar3->cstep = local_248.cstep;
      }
      if (piVar16 != (int *)0x0) {
        LOCK();
        *piVar16 = *piVar16 + -1;
        UNLOCK();
        if (*piVar16 == 0) {
          if (local_248.allocator == (Allocator *)0x0) {
            free(local_248.data);
          }
          else {
            (*(local_248.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      if (local_c0.refcount != (int *)0x0) {
        LOCK();
        *local_c0.refcount = *local_c0.refcount + -1;
        UNLOCK();
        if (*local_c0.refcount == 0) {
          if (local_c0.allocator == (Allocator *)0x0) {
            free(local_c0.data);
          }
          else {
            (*(local_c0.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      if (local_78.refcount != (int *)0x0) {
        LOCK();
        *local_78.refcount = *local_78.refcount + -1;
        UNLOCK();
        if (*local_78.refcount == 0) {
          if (local_78.allocator == (Allocator *)0x0) {
            free(local_78.data);
          }
          else {
            (*(local_78.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      iVar11 = 0;
    }
  }
  piVar16 = (int *)CONCAT44(local_1c8.refcount._4_4_,local_1c8.refcount._0_4_);
  if (piVar16 != (int *)0x0) {
    LOCK();
    *piVar16 = *piVar16 + -1;
    UNLOCK();
    if (*piVar16 == 0) {
      if (local_1c8.allocator == (Allocator *)0x0) {
        free(local_1c8.data);
      }
      else {
        (*(local_1c8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar11;
}

Assistant:

int DeformableConv2D_x86_avx::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& bottom_blob = bottom_blobs[0];
    const Mat& offset = bottom_blobs[1];

    const bool has_mask = (bottom_blobs.size() == 3);

    const int w = bottom_blob.w;
    const int h = bottom_blob.h;
    const int in_c = bottom_blob.c;
    const size_t elemsize = bottom_blob.elemsize;

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    const int out_w = (w + pad_left + pad_right - kernel_extent_w) / stride_w + 1;
    const int out_h = (h + pad_top + pad_bottom - kernel_extent_h) / stride_h + 1;

    // output = im2col matmul weight_t, im2col.shape is [out_h * out_w, kernel_h * kernel_w * in_c] (in python),
    // weight_t.shape is [num_output, kernel_h * kernel_w * in_c] (in python),
    // output.shape   is [out_h * out_w, num_output] (in python).
    Mat im2col;
    im2col.create(kernel_h * kernel_w * in_c * out_h * out_w, elemsize, opt.blob_allocator);
    if (im2col.empty())
        return -100;

    Mat& output = top_blobs[0];
    output.create(num_output, out_h * out_w, elemsize, opt.blob_allocator);
    if (output.empty())
        return -100;

    Mat bottom_blob_flatten = bottom_blob.reshape(w * h * in_c);
    Mat offset_flatten = offset.reshape(offset.w * offset.h * offset.c);
    const float* data_im_ptr = bottom_blob_flatten;
    const float* data_offset_ptr = offset_flatten;
    float* im2col_ptr = im2col;

    // im2col
    #pragma omp parallel for num_threads(opt.num_threads)
    for (int h_col = 0; h_col < out_h; h_col++)
    {
        for (int w_col = 0; w_col < out_w; w_col++)
        {
            int h_in = h_col * stride_h - pad_top;
            int w_in = w_col * stride_w - pad_left;
            float* data_col_ptr = im2col_ptr + (h_col * out_w + w_col) * kernel_h * kernel_w * in_c;
            for (int i = 0; i < kernel_h; i++)
            {
                for (int j = 0; j < kernel_w; j++)
                {
                    const int data_offset_h_ptr = (((i * kernel_w + j) * 2) * out_h + h_col) * out_w + w_col;
                    const int data_offset_w_ptr = (((i * kernel_w + j) * 2 + 1) * out_h + h_col) * out_w + w_col;

                    const float offset_h = data_offset_ptr[data_offset_h_ptr];
                    const float offset_w = data_offset_ptr[data_offset_w_ptr];
                    const float mask_ = has_mask ? bottom_blobs[2].channel(i * kernel_w + j).row(h_col)[w_col] : 1.f;
                    const float h_im = h_in + i * dilation_h + offset_h;
                    const float w_im = w_in + j * dilation_w + offset_w;

                    // Bilinear
                    const bool cond = h_im > -1 && w_im > -1 && h_im < h && w_im < w;
                    float w1 = 0.f;
                    float w2 = 0.f;
                    float w3 = 0.f;
                    float w4 = 0.f;
                    bool v1_cond = false;
                    bool v2_cond = false;
                    bool v3_cond = false;
                    bool v4_cond = false;
                    int v1_pos = 0;
                    int v2_pos = 0;
                    int v3_pos = 0;
                    int v4_pos = 0;
                    if (cond)
                    {
                        int h_low = floor(h_im);
                        int w_low = floor(w_im);
                        int h_high = h_low + 1;
                        int w_high = w_low + 1;

                        float lh = h_im - h_low;
                        float lw = w_im - w_low;
                        float hh = 1 - lh;
                        float hw = 1 - lw;

                        v1_cond = (h_low >= 0 && w_low >= 0);
                        v2_cond = (h_low >= 0 && w_high <= w - 1);
                        v3_cond = (h_high <= h - 1 && w_low >= 0);
                        v4_cond = (h_high <= h - 1 && w_high <= w - 1);
                        if (v1_cond)
                            v1_pos = h_low * w + w_low;
                        if (v2_cond)
                            v2_pos = h_low * w + w_high;
                        if (v3_cond)
                            v3_pos = h_high * w + w_low;
                        if (v4_cond)
                            v4_pos = h_high * w + w_high;

                        w1 = hh * hw;
                        w2 = hh * lw;
                        w3 = lh * hw;
                        w4 = lh * lw;
                    }

                    const float* data_im_channel_ptr = data_im_ptr;
                    for (int c_im = 0; c_im < in_c; c_im++)
                    {
                        float val = 0.f;
                        if (cond)
                        {
                            float v1 = v1_cond ? data_im_channel_ptr[v1_pos] : 0.f;
                            float v2 = v2_cond ? data_im_channel_ptr[v2_pos] : 0.f;
                            float v3 = v3_cond ? data_im_channel_ptr[v3_pos] : 0.f;
                            float v4 = v4_cond ? data_im_channel_ptr[v4_pos] : 0.f;
                            val = w1 * v1 + w2 * v2 + w3 * v3 + w4 * v4;
                        }
                        *data_col_ptr = val * mask_;
                        data_col_ptr += 1;
                        data_im_channel_ptr += h * w;
                    }
                }
            }
        }
    }
    im2col = im2col.reshape(kernel_h * kernel_w * in_c, out_h * out_w);
    // call InnerProduct
    inner_product->forward(im2col, output, opt);
    ncnn::Mat output_t;
    // call Permute
    permute->forward(output, output_t, opt);
    output_t = output_t.reshape(out_w, out_h, num_output);
    top_blobs[0] = output_t;
    return 0;
}